

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

string * __thiscall
duckdb::DataTableInfo::GetSchemaName_abi_cxx11_(string *__return_storage_ptr__,DataTableInfo *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->schema);
  return __return_storage_ptr__;
}

Assistant:

string DataTableInfo::GetSchemaName() {
	return schema;
}